

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddmc.c
# Opt level: O0

int main(int argc,char **argv)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  size_t local_20;
  size_t max;
  char **argv_local;
  int argc_local;
  
  parse_args(argc,argv);
  setlocale(1,"en_US.utf-8");
  t_start = wctime();
  lace_start(workers,1000000);
  local_20 = 0x400000000;
  sVar1 = getMaxMemory();
  if (sVar1 < 0x400000000) {
    sVar1 = getMaxMemory();
    local_20 = (sVar1 / 10) * 9;
  }
  printf("Setting Sylvan main tables memory to ");
  auVar2._8_4_ = (int)(local_20 >> 0x20);
  auVar2._0_8_ = local_20;
  auVar2._12_4_ = 0x45300000;
  print_h((auVar2._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0));
  printf(" max.\n");
  sylvan_set_limits(local_20,1,0x10);
  sylvan_init_package();
  sylvan_init_ldd();
  sylvan_gc_hook_pregc(gc_start_CALL);
  sylvan_gc_hook_postgc(gc_end_CALL);
  run_RUN();
  print_memory_usage();
  sylvan_stats_report(_stdout);
  lace_stop();
  return 0;
}

Assistant:

int
main(int argc, char **argv)
{
    /**
     * Parse command line, set locale, set startup time for INFO messages.
     */
    parse_args(argc, argv);
    setlocale(LC_NUMERIC, "en_US.utf-8");
    t_start = wctime();

    /**
     * Initialize Lace.
     *
     * First: setup with given number of workers (0 for autodetect) and some large size task queue.
     * Second: start all worker threads with default settings.
     * Third: setup local variables using the LACE_ME macro.
     */
    lace_start(workers, 1000000);

    /**
     * Initialize Sylvan.
     *
     * First: set memory limits
     * - 2 GB memory, nodes table twice as big as cache, initial size halved 6x
     *   (that means it takes 6 garbage collections to get to the maximum nodes&cache size)
     * Second: initialize package and subpackages
     * Third: add hooks to report garbage collection
     */

    size_t max = 16LL<<30;
    if (max > getMaxMemory()) max = getMaxMemory()/10*9;
    printf("Setting Sylvan main tables memory to ");
    print_h(max);
    printf(" max.\n");

    sylvan_set_limits(max, 1, 16);
    sylvan_init_package();
    sylvan_init_ldd();
    sylvan_gc_hook_pregc(TASK(gc_start));
    sylvan_gc_hook_postgc(TASK(gc_end));

    RUN(run);

    print_memory_usage();
    sylvan_stats_report(stdout);

    lace_stop();
}